

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O1

bool __thiscall dlib::thread_pool_implementation::is_task_thread(thread_pool_implementation *this)

{
  ulong uVar1;
  pthread_t *ppVar2;
  size_t sVar3;
  ulong uVar4;
  pthread_t pVar5;
  ulong uVar6;
  bool bVar7;
  auto_mutex M;
  auto_mutex local_28;
  
  local_28.m = &this->m;
  local_28.r = (rmutex *)0x0;
  local_28.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_28.m);
  pVar5 = pthread_self();
  uVar1 = (this->worker_thread_ids).array_size;
  bVar7 = uVar1 != 0;
  if (bVar7) {
    ppVar2 = (this->worker_thread_ids).array_elements;
    bVar7 = true;
    if (*ppVar2 != pVar5) {
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        if (uVar1 == uVar6) break;
        uVar4 = uVar6 + 1;
      } while (ppVar2[uVar6] != pVar5);
      bVar7 = uVar6 < uVar1;
    }
  }
  sVar3 = (this->tasks).array_size;
  auto_mutex::unlock(&local_28);
  return (bool)(bVar7 | sVar3 == 0);
}

Assistant:

bool thread_pool_implementation::
    is_task_thread (
    ) const
    {
        auto_mutex M(m);
        return is_worker_thread(get_thread_id());
    }